

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O3

int ffgpxfll(fitsfile *fptr,int datatype,LONGLONG *firstpix,LONGLONG nelem,void *array,
            char *nullarray,int *anynul,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  LONGLONG firstelem;
  int naxis;
  LONGLONG naxes [9];
  
  if (nelem == 0 || 0 < *status) {
    return *status;
  }
  ffgidm(fptr,&naxis,status);
  ffgiszll(fptr,9,naxes,status);
  if ((long)naxis < 1) {
    firstelem = 1;
  }
  else {
    lVar2 = 1;
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar4 = lVar4 + (firstpix[lVar3] + -1) * lVar2;
      lVar2 = lVar2 * naxes[lVar3];
      lVar3 = lVar3 + 1;
    } while (naxis != lVar3);
    firstelem = lVar4 + 1;
  }
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 != 0) {
    fits_read_compressed_pixels
              (fptr,datatype,firstelem,nelem,2,(void *)0x0,array,nullarray,anynul,status);
    goto LAB_001400fe;
  }
  if (datatype < 0x28) {
    if (datatype < 0x15) {
      if (datatype == 0xb) {
        ffgclb(fptr,2,1,firstelem,nelem,1,2,'\0',(uchar *)array,nullarray,anynul,status);
        goto LAB_001400fe;
      }
      if (datatype == 0xc) {
        ffgclsb(fptr,2,1,firstelem,nelem,1,2,'\0',(char *)array,nullarray,anynul,status);
        goto LAB_001400fe;
      }
      if (datatype == 0x14) {
        ffgclui(fptr,2,1,firstelem,nelem,1,2,0,(unsigned_short *)array,nullarray,anynul,status);
        goto LAB_001400fe;
      }
    }
    else {
      if (datatype == 0x15) {
        ffgcli(fptr,2,1,firstelem,nelem,1,2,0,(short *)array,nullarray,anynul,status);
        goto LAB_001400fe;
      }
      if (datatype == 0x1e) {
        ffgcluk(fptr,2,1,firstelem,nelem,1,2,0,(uint *)array,nullarray,anynul,status);
        goto LAB_001400fe;
      }
      if (datatype == 0x1f) {
        ffgclk(fptr,2,1,firstelem,nelem,1,2,0,(int *)array,nullarray,anynul,status);
        goto LAB_001400fe;
      }
    }
  }
  else if (datatype < 0x50) {
    if (datatype == 0x28) {
      ffgcluj(fptr,2,1,firstelem,nelem,1,2,0,(unsigned_long *)array,nullarray,anynul,status);
      goto LAB_001400fe;
    }
    if (datatype == 0x29) {
      ffgclj(fptr,2,1,firstelem,nelem,1,2,0,(long *)array,nullarray,anynul,status);
      goto LAB_001400fe;
    }
    if (datatype == 0x2a) {
      ffgcle(fptr,2,1,firstelem,nelem,1,2,0.0,(float *)array,nullarray,anynul,status);
      goto LAB_001400fe;
    }
  }
  else {
    if (datatype == 0x50) {
      ffgclujj(fptr,2,1,firstelem,nelem,1,2,0,(ULONGLONG *)array,nullarray,anynul,status);
      goto LAB_001400fe;
    }
    if (datatype == 0x51) {
      ffgcljj(fptr,2,1,firstelem,nelem,1,2,0,(LONGLONG *)array,nullarray,anynul,status);
      goto LAB_001400fe;
    }
    if (datatype == 0x52) {
      ffgcld(fptr,2,1,firstelem,nelem,1,2,0.0,(double *)array,nullarray,anynul,status);
      goto LAB_001400fe;
    }
  }
  *status = 0x19a;
LAB_001400fe:
  return *status;
}

Assistant:

int ffgpxfll( fitsfile *fptr, /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG *firstpix, /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,       /* I - number of values to read              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - returned array of null value flags      */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  The nullarray values will = 1 if the corresponding array value is null.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    int nullcheck = 2;
    LONGLONG naxes[9];
    LONGLONG dimsize = 1, firstelem;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    /* calculate the position of the first element in the array */
    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_read_compressed_pixels(fptr, datatype, firstelem, nelem,
            nullcheck, NULL, array, nullarray, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (signed char *) array, nullarray, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned short *) array, nullarray, anynul, status);
    }
    else if (datatype == TSHORT)
    {
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (short *) array, nullarray, anynul, status);
    }
    else if (datatype == TUINT)
    {
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned int *) array, nullarray, anynul, status);
    }
    else if (datatype == TINT)
    {
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (int *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONG)
    {
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned long *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONG)
    {
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (long *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (ULONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (LONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (double *) array, nullarray, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}